

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesDiagnosticsRunTests
          (zes_diag_handle_t hDiagnostics,uint32_t startIndex,uint32_t endIndex,
          zes_diag_result_t *pResult)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_61;
  zes_diag_result_t *local_60;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = pResult;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zesDiagnosticsRunTests(hDiagnostics, startIndex, endIndex, pResult)",&local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0xce0) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0xce0);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesDiagnosticsRunTestsPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                                hDiagnostics,startIndex,endIndex,local_60),
           result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hDiagnostics,startIndex,endIndex,local_60);
          lVar4 = 0;
          goto LAB_0016ac62;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar3 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x200))(plVar1,hDiagnostics,startIndex,endIndex,local_60);
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0016aca0;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar4 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x208))(plVar1,hDiagnostics,startIndex,endIndex,local_60,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0016ac62:
    result = zVar2;
    if (lVar5 == lVar4) break;
  }
LAB_0016aca0:
  logAndPropagateResult("zesDiagnosticsRunTests",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDiagnosticsRunTests(
        zes_diag_handle_t hDiagnostics,                 ///< [in] Handle for the component.
        uint32_t startIndex,                            ///< [in] The index of the first test to run. Set to
                                                        ///< ::ZES_DIAG_FIRST_TEST_INDEX to start from the beginning.
        uint32_t endIndex,                              ///< [in] The index of the last test to run. Set to
                                                        ///< ::ZES_DIAG_LAST_TEST_INDEX to complete all tests after the start test.
        zes_diag_result_t* pResult                      ///< [in,out] The result of the diagnostics
        )
    {
        context.logger->log_trace("zesDiagnosticsRunTests(hDiagnostics, startIndex, endIndex, pResult)");

        auto pfnRunTests = context.zesDdiTable.Diagnostics.pfnRunTests;

        if( nullptr == pfnRunTests )
            return logAndPropagateResult("zesDiagnosticsRunTests", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDiagnosticsRunTestsPrologue( hDiagnostics, startIndex, endIndex, pResult );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDiagnosticsRunTestsPrologue( hDiagnostics, startIndex, endIndex, pResult );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }

        auto driver_result = pfnRunTests( hDiagnostics, startIndex, endIndex, pResult );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDiagnosticsRunTestsEpilogue( hDiagnostics, startIndex, endIndex, pResult ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDiagnosticsRunTests", result);
        }

        return logAndPropagateResult("zesDiagnosticsRunTests", driver_result);
    }